

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutFormatTarget.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::StdOutFormatTarget::writeChars
          (StdOutFormatTarget *this,XMLByte *toWrite,XMLSize_t count,XMLFormatter *param_3)

{
  size_t sVar1;
  XMLPlatformUtilsException *this_00;
  
  sVar1 = fwrite(toWrite,1,count,_stdout);
  if (sVar1 == count) {
    fflush(_stdout);
    return;
  }
  this_00 = (XMLPlatformUtilsException *)__cxa_allocate_exception(0x30);
  XMLPlatformUtilsException::XMLPlatformUtilsException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/StdOutFormatTarget.cpp"
             ,0x2e,File_CouldNotWriteToFile,(MemoryManager *)0x0);
  __cxa_throw(this_00,&XMLPlatformUtilsException::typeinfo,XMLException::~XMLException);
}

Assistant:

void StdOutFormatTarget::writeChars(const XMLByte* const  toWrite
                                  , const XMLSize_t       count
                                  , XMLFormatter* const)
{
    XMLSize_t written=fwrite(toWrite, sizeof(XMLByte), count, stdout);
    if(written!=count)
        ThrowXML(XMLPlatformUtilsException, XMLExcepts::File_CouldNotWriteToFile);
    fflush(stdout);
}